

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvector-generator.cpp
# Opt level: O0

void __thiscall callback_data::reset(callback_data *this)

{
  bool bVar1;
  reference ppgVar2;
  __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
  *in_RDI;
  ggml_tensor *ptr_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *__range1_2;
  ggml_tensor *ptr_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *__range1_1;
  ggml_tensor *ptr;
  iterator __end1;
  iterator __begin1;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *__range1;
  vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *in_stack_ffffffffffffff88;
  __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
  local_58;
  __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
  *local_50;
  ggml_tensor *local_48;
  ggml_tensor **local_40;
  __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
  local_38;
  __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
  *local_30;
  ggml_tensor *local_28;
  ggml_tensor **local_20;
  __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
  local_18;
  __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
  *local_10;
  
  local_10 = in_RDI + 3;
  local_18._M_current =
       (ggml_tensor **)
       std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::begin(in_stack_ffffffffffffff88);
  local_20 = (ggml_tensor **)
             std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::end
                       (in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
                               *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    ppgVar2 = __gnu_cxx::
              __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
              ::operator*(&local_18);
    local_28 = *ppgVar2;
    free(local_28->data);
    __gnu_cxx::
    __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>::
    operator++(&local_18);
  }
  local_30 = in_RDI + 6;
  local_38._M_current =
       (ggml_tensor **)
       std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::begin(in_stack_ffffffffffffff88);
  local_40 = (ggml_tensor **)
             std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::end
                       (in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
                               *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    ppgVar2 = __gnu_cxx::
              __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
              ::operator*(&local_38);
    local_48 = *ppgVar2;
    free(local_48->data);
    __gnu_cxx::
    __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>::
    operator++(&local_38);
  }
  local_50 = in_RDI + 9;
  local_58._M_current =
       (ggml_tensor **)
       std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::begin(in_stack_ffffffffffffff88);
  std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::end(in_stack_ffffffffffffff88);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
                               *)in_stack_ffffffffffffff88);
    if (!bVar1) break;
    ppgVar2 = __gnu_cxx::
              __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>
              ::operator*(&local_58);
    free((*ppgVar2)->data);
    __gnu_cxx::
    __normal_iterator<ggml_tensor_**,_std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>_>::
    operator++(&local_58);
  }
  std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::clear
            ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)0x17eb4c);
  std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::clear
            ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)0x17eb5a);
  std::vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_>::clear
            ((vector<ggml_tensor_*,_std::allocator<ggml_tensor_*>_> *)0x17eb68);
  if (in_RDI->_M_current != (ggml_tensor **)0x0) {
    ggml_free(in_RDI->_M_current);
  }
  in_RDI->_M_current = (ggml_tensor **)0x0;
  return;
}

Assistant:

void reset() {
        for (auto ptr : v_pos) free(ptr->data);
        for (auto ptr : v_neg) free(ptr->data);
        for (auto ptr : v_diff_filtered) free(ptr->data);
        v_pos.clear();
        v_neg.clear();
        v_diff_filtered.clear();
        if (ctx_ggml) {
            ggml_free(ctx_ggml);
        }
        ctx_ggml = nullptr;
    }